

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O2

double mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                 (PLConstraint *con,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  pointer pdVar5;
  long lVar6;
  PLPoints *this;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  this = PLConParams::GetPLPoints
                   (&(con->
                     super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                     params_);
  dVar2 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start
          [(con->super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).args_.
           _M_elems[0]];
  pdVar4 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*pdVar4 <= dVar2) {
    pdVar1 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
      lVar7 = -0x200000000;
      lVar6 = 0;
      do {
        lVar8 = lVar6;
        lVar7 = lVar7 + 0x100000000;
        dVar9 = *(double *)((long)pdVar4 + lVar8);
        lVar6 = lVar8 + 8;
      } while (dVar9 < dVar2);
      if ((dVar9 != dVar2) || (NAN(dVar9) || NAN(dVar2))) {
        pdVar5 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar10 = *(double *)((long)pdVar5 + (lVar7 >> 0x1d));
        dVar3 = *(double *)((long)pdVar4 + (lVar7 >> 0x1d));
        dVar10 = ((dVar2 - dVar3) * (*(double *)((long)pdVar5 + lVar8) - dVar10)) / (dVar9 - dVar3)
                 + dVar10;
      }
      else {
        dVar10 = *(double *)
                  ((long)(this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8);
      }
    }
    else {
      dVar10 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      dVar9 = PLPoints::PostSlope(this);
      dVar10 = dVar9 * (dVar2 - (this->x_).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish[-1]) + dVar10;
    }
  }
  else {
    dVar10 = *(this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar9 = PLPoints::PreSlope(this);
    dVar10 = dVar10 - (*(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start - dVar2) * dVar9;
  }
  return dVar10;
}

Assistant:

double ComputeValue(const PLConstraint& con, const VarVec& x) {
  const auto& plp = con.GetParameters().GetPLPoints();
  assert(!plp.empty());
  auto x0 = x[con.GetArguments()[0]];        // position
  if (x0<plp.x_.front())
    return plp.y_.front()
        - plp.PreSlope()*(plp.x_.front() - x0);
  if (x0>plp.x_.back())
    return plp.y_.back()
        + plp.PostSlope()*(x0 - plp.x_.back());
  int i0=0;
  for ( ; x0 > plp.x_[i0]; ++i0) ;
  return plp.x_[i0]==x0
      ? plp.y_[i0]
        : (plp.y_[i0-1]
           + (plp.y_[i0]-plp.y_[i0-1])
        * (x0-plp.x_[i0-1]) / (plp.x_[i0]-plp.x_[i0-1]));
}